

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<double>::TPZBlockDiagonal
          (TPZBlockDiagonal<double> *this,TPZBlockDiagonal<double> *A)

{
  TPZVec<double> *copy;
  long *in_RSI;
  TPZVec<double> *in_RDI;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<double> *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZBlockDiagonal<double>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  copy = (TPZVec<double> *)(**(code **)(*in_RSI + 0x60))();
  (**(code **)(*in_RSI + 0x60))();
  TPZMatrix<double>::TPZMatrix
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int64_t)in_RDI,(int64_t)copy);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZBlockDiagonal_023f0d28;
  TPZVec<double>::TPZVec(in_RDI,copy);
  TPZVec<long>::TPZVec((TPZVec<long> *)in_RDI,(TPZVec<long> *)copy);
  TPZVec<int>::TPZVec((TPZVec<int> *)in_RDI,(TPZVec<int> *)copy);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal (const TPZBlockDiagonal<TVar> & A)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>( A.Dim(), A.Dim() ), fStorage(A.fStorage),
fBlockPos(A.fBlockPos), fBlockSize(A.fBlockSize)
{
}